

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::SIMDNewPFor
          (SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *this)

{
  IntegerCODEC *in_RDI;
  Simple16<false> *in_stack_ffffffffffffffa0;
  allocator_type *in_stack_ffffffffffffffb0;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffb8;
  IntegerCODEC *__n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  allocator_type local_17;
  
  IntegerCODEC::IntegerCODEC(in_RDI);
  in_RDI->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00481118;
  Simple16<false>::Simple16(in_stack_ffffffffffffffa0);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x155288);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1552a8);
  __n = in_RDI + 5;
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffea;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1552c5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_00,(size_type)__n,in_stack_ffffffffffffffb0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1552e5);
  __a = &local_17;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x155302);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x155322);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x15533e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x15535d);
  return;
}

Assistant:

SIMDNewPFor()
      : ecoder(), exceptionsPositions(BlockSize), exceptionsValues(BlockSize),
        exceptions(4 * BlockSize + TAIL_MERGIN + 1), tobecoded(BlockSize) {}